

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O2

void i2p_tests::unlimited_recv_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_6c0;
  pointer local_6b8;
  char *local_6b0;
  char *local_6a8;
  pointer local_6a0;
  pointer local_698;
  char *local_690;
  char *local_688;
  pointer local_680;
  pointer local_678;
  char *local_670;
  char *local_668;
  pointer local_660;
  pointer local_658;
  char *local_650;
  char *local_648;
  pointer local_640;
  pointer local_638;
  char *local_630;
  char *local_628;
  basic_wrap_stringstream<char> local_620;
  unlimited_recv t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
  ;
  local_628 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"unlimited_recv");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_640 = (pbVar3->_M_dataplus)._M_p;
  local_638 = local_640 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2f;
  file.m_begin = (iterator)&local_630;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_640,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  unlimited_recv::unlimited_recv(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
  ;
  local_648 = "";
  memset(&local_620,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_620);
  std::operator<<((ostream *)&local_620,'\"');
  std::operator<<((ostream *)&local_620,"unlimited_recv");
  std::operator<<((ostream *)&local_620,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_620);
  local_660 = (pbVar3->_M_dataplus)._M_p;
  local_658 = local_660 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x2f;
  file_00.m_begin = (iterator)&local_650;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_660,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_620);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
  ;
  local_668 = "";
  memset(&local_620,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_620);
  std::operator<<((ostream *)&local_620,'\"');
  std::operator<<((ostream *)&local_620,"unlimited_recv");
  std::operator<<((ostream *)&local_620,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_620);
  local_680 = (pbVar3->_M_dataplus)._M_p;
  local_678 = local_680 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x2f;
  file_01.m_begin = (iterator)&local_670;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_680,msg_01);
  this = &local_620;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  unlimited_recv::test_method((unlimited_recv *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
  ;
  local_688 = "";
  memset(&local_620,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_620);
  std::operator<<((ostream *)&local_620,'\"');
  std::operator<<((ostream *)&local_620,"unlimited_recv");
  std::operator<<((ostream *)&local_620,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_620);
  local_6a0 = (pbVar3->_M_dataplus)._M_p;
  local_698 = local_6a0 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x2f;
  file_02.m_begin = (iterator)&local_690;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6a0,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_620);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
  ;
  local_6a8 = "";
  memset(&local_620,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_620);
  std::operator<<((ostream *)&local_620,'\"');
  std::operator<<((ostream *)&local_620,"unlimited_recv");
  std::operator<<((ostream *)&local_620,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_620);
  local_6c0 = (pbVar3->_M_dataplus)._M_p;
  local_6b8 = local_6c0 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x2f;
  file_03.m_begin = (iterator)&local_6b0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_6c0,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_620);
  EnvTestingSetup::~EnvTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unlimited_recv)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>(std::string(i2p::sam::MAX_MSG_SIZE + 1, 'a'));
    };

    CThreadInterrupt interrupt;
    const std::optional<CService> addr{Lookup("127.0.0.1", 9000, false)};
    const Proxy sam_proxy(addr.value(), false);
    i2p::sam::Session session(gArgs.GetDataDirNet() / "test_i2p_private_key", sam_proxy, &interrupt);

    {
        ASSERT_DEBUG_LOG("Creating persistent SAM session");
        ASSERT_DEBUG_LOG("too many bytes without a terminator");

        i2p::Connection conn;
        bool proxy_error;
        BOOST_REQUIRE(!session.Connect(CService{}, conn, proxy_error));
    }
}